

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::Generators::Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>::
next(Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  long in_RDI;
  bool current_status;
  undefined1 local_1;
  
  uVar1 = *(ulong *)(in_RDI + 0x20);
  sVar3 = std::
          vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          ::size((vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  *)(in_RDI + 8));
  if (uVar1 < sVar3) {
    std::
    vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
    ::operator[]((vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  *)(in_RDI + 8),*(size_type *)(in_RDI + 0x20));
    bVar2 = GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>::
            next((GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
                  *)0x448ec6);
    if (!bVar2) {
      *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
    }
    uVar1 = *(ulong *)(in_RDI + 0x20);
    sVar3 = std::
            vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
            ::size((vector<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                    *)(in_RDI + 8));
    local_1 = uVar1 < sVar3;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool next() override {
            if (m_current >= m_generators.size()) {
                return false;
            }
            const bool current_status = m_generators[m_current].next();
            if (!current_status) {
                ++m_current;
            }
            return m_current < m_generators.size();
        }